

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

float If_CutEdgeFlow(If_Man_t *p,If_Cut_t *pCut)

{
  uint uVar1;
  If_Obj_t *pIVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  uVar1 = *(uint *)&pCut->field_0x1c;
  fVar4 = (float)(uVar1 >> 0x18);
  uVar3 = 0;
  while( true ) {
    if (uVar1 >> 0x18 <= uVar3) {
      return fVar4;
    }
    pIVar2 = If_ManObj(p,(int)(&pCut[1].Area)[uVar3]);
    if (pIVar2 == (If_Obj_t *)0x0) break;
    if ((pIVar2->nRefs == 0) ||
       (((undefined1  [112])*pIVar2 & (undefined1  [112])0xf) == (undefined1  [112])0x1)) {
      fVar5 = (pIVar2->CutBest).Edge;
    }
    else {
      fVar5 = pIVar2->EstRefs;
      if (fVar5 < p->fEpsilon || fVar5 == p->fEpsilon) {
        __assert_fail("pLeaf->EstRefs > p->fEpsilon",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifCut.c"
                      ,0x3c1,"float If_CutEdgeFlow(If_Man_t *, If_Cut_t *)");
      }
      fVar5 = (pIVar2->CutBest).Edge / fVar5;
    }
    fVar4 = fVar4 + fVar5;
    uVar3 = uVar3 + 1;
    uVar1 = *(uint *)&pCut->field_0x1c;
  }
  return fVar4;
}

Assistant:

float If_CutEdgeFlow( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float Flow;
    int i;
    Flow = pCut->nLeaves;
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        if ( pLeaf->nRefs == 0 || If_ObjIsConst1(pLeaf) )
            Flow += If_ObjCutBest(pLeaf)->Edge;
        else 
        {
            assert( pLeaf->EstRefs > p->fEpsilon );
            Flow += If_ObjCutBest(pLeaf)->Edge / pLeaf->EstRefs;
        }
    }
    return Flow;
}